

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool __thiscall tinyusdz::Layer::find_primspec_at(Layer *this,Path *path,PrimSpec **ps,string *err)

{
  value_type pPVar1;
  bool bVar2;
  ostream *poVar3;
  pointer ppVar4;
  PrimSpec *parent_00;
  value_type *ppPVar5;
  string *psVar6;
  mapped_type *ppPVar7;
  allocator local_7d1;
  string local_7d0;
  optional<const_tinyusdz::PrimSpec_*> local_7b0;
  undefined1 local_7a0 [8];
  optional<const_tinyusdz::PrimSpec_*> pv;
  value_type_conflict *parent;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *__range1;
  _Self local_768;
  iterator ret;
  string local_740;
  allocator local_719;
  string local_718 [32];
  fmt local_6f8 [32];
  ostringstream local_6d8 [8];
  ostringstream ss_e_3;
  string local_560 [32];
  string local_540;
  allocator local_519;
  string local_518 [32];
  fmt local_4f8 [32];
  ostringstream local_4d8 [8];
  ostringstream ss_e_2;
  string local_360 [32];
  ostringstream local_340 [8];
  ostringstream ss_e_1;
  string local_1c8 [32];
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  string *err_local;
  PrimSpec **ps_local;
  Path *path_local;
  Layer *this_local;
  
  if (ps == (PrimSpec **)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar3 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"find_primspec_at");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x861);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1a8,"Invalid PrimSpec dst argument");
    ::std::operator<<(poVar3,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1c8);
      ::std::__cxx11::string::~string(local_1c8);
    }
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    bVar2 = Path::is_valid(path);
    if (bVar2) {
      bVar2 = Path::is_relative_path(path);
      if (bVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_4d8);
        poVar3 = ::std::operator<<((ostream *)local_4d8,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"find_primspec_at");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x86b);
        ::std::operator<<(poVar3," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_518,"TODO: Relative path: {}",&local_519);
        Path::full_path_name_abi_cxx11_(&local_540,path);
        fmt::format<std::__cxx11::string>
                  (local_4f8,(string *)local_518,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_540);
        poVar3 = ::std::operator<<((ostream *)local_4d8,(string *)local_4f8);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)local_4f8);
        ::std::__cxx11::string::~string((string *)&local_540);
        ::std::__cxx11::string::~string(local_518);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_519);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_560);
          ::std::__cxx11::string::~string(local_560);
        }
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_4d8);
      }
      else {
        bVar2 = Path::is_absolute_path(path);
        if (bVar2) {
          if ((this->_dirty & 1U) == 0) {
            psVar6 = Path::prim_part_abi_cxx11_(path);
            local_768._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                         *)&this->_primspec_path_cache,psVar6);
            __range1 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                        *)::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                                 *)&this->_primspec_path_cache);
            bVar2 = ::std::operator!=(&local_768,(_Self *)&__range1);
            if (bVar2) {
              ppVar4 = ::std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>
                       ::operator->(&local_768);
              *ps = ppVar4->second;
              this_local._7_1_ = 1;
              goto LAB_0037daf4;
            }
          }
          else {
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
            ::clear((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                     *)&this->_primspec_path_cache);
            this->_dirty = false;
          }
          __end1 = ::std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                   ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                            *)&this->_prim_specs);
          parent = (value_type_conflict *)
                   ::std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                   ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                          *)&this->_prim_specs);
          while (bVar2 = std::__detail::operator!=
                                   ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                                     *)&__end1,
                                    (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                                     *)&parent), bVar2) {
            pv.contained = (storage_t<const_tinyusdz::PrimSpec_*>)
                           ::std::__detail::
                           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
                           ::operator*(&__end1);
            parent_00 = (PrimSpec *)((long)pv.contained + 0x20);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_7d0,"",&local_7d1);
            anon_unknown_237::GetPrimSpecAtPathRec(&local_7b0,parent_00,&local_7d0,path,0);
            nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::
            optional<const_tinyusdz::PrimSpec_*,_0>
                      ((optional<const_tinyusdz::PrimSpec_*> *)local_7a0,&local_7b0);
            nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::~optional(&local_7b0);
            ::std::__cxx11::string::~string((string *)&local_7d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
            bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_7a0);
            if (bVar2) {
              ppPVar5 = nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::value
                                  ((optional<const_tinyusdz::PrimSpec_*> *)local_7a0);
              *ps = *ppPVar5;
              ppPVar5 = nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::value
                                  ((optional<const_tinyusdz::PrimSpec_*> *)local_7a0);
              pPVar1 = *ppPVar5;
              psVar6 = Path::prim_part_abi_cxx11_(path);
              ppPVar7 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                                      *)&this->_primspec_path_cache,psVar6);
              *ppPVar7 = pPVar1;
              this_local._7_1_ = 1;
            }
            nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::~optional
                      ((optional<const_tinyusdz::PrimSpec_*> *)local_7a0);
            if (bVar2) goto LAB_0037daf4;
            ::std::__detail::
            _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
            ::operator++(&__end1);
          }
          this_local._7_1_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_6d8);
          poVar3 = ::std::operator<<((ostream *)local_6d8,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"find_primspec_at");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x86f);
          ::std::operator<<(poVar3," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_718,"Path is not absolute path: {}",&local_719);
          Path::full_path_name_abi_cxx11_(&local_740,path);
          fmt::format<std::__cxx11::string>
                    (local_6f8,(string *)local_718,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_740
                    );
          poVar3 = ::std::operator<<((ostream *)local_6d8,(string *)local_6f8);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)local_6f8);
          ::std::__cxx11::string::~string((string *)&local_740);
          ::std::__cxx11::string::~string(local_718);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_719);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,(string *)&ret);
            ::std::__cxx11::string::~string((string *)&ret);
          }
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_6d8);
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_340);
      poVar3 = ::std::operator<<((ostream *)local_340,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"find_primspec_at");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x866);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_340,"Invalid path");
      ::std::operator<<(poVar3,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_360);
        ::std::__cxx11::string::~string(local_360);
      }
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_340);
    }
  }
LAB_0037daf4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Layer::find_primspec_at(const Path &path, const PrimSpec **ps,
                             std::string *err) const {
  if (!ps) {
    PUSH_ERROR_AND_RETURN("Invalid PrimSpec dst argument");
  }

  if (!path.is_valid()) {
    DCOUT("Invalid path.");
    PUSH_ERROR_AND_RETURN("Invalid path");
  }

  if (path.is_relative_path()) {
    // TODO
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: Relative path: {}", path.full_path_name()));
  }

  if (!path.is_absolute_path()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Path is not absolute path: {}", path.full_path_name()));
  }

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (_dirty) {
    DCOUT("clear cache.");
    // Clear cache.
    _primspec_path_cache.clear();

    _dirty = false;
  } else {
    // First find from a cache.
    auto ret = _primspec_path_cache.find(path.prim_part());
    if (ret != _primspec_path_cache.end()) {
      DCOUT("Found cache.");
      (*ps) = ret->second;
      return true;
    }
  }

  // Brute-force search.
  for (const auto &parent : _prim_specs) {
    if (auto pv = GetPrimSpecAtPathRec(&parent.second, /* parent_path */ "",
                                       path, /* depth */ 0)) {
      (*ps) = pv.value();

      // Add to cache.
      // Assume pointer address does not change unless dirty state changes.
      _primspec_path_cache[path.prim_part()] = pv.value();
      return true;
    }
  }

  return false;
}